

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_0::clampFloatingPointTexture(PixelBufferAccess *access)

{
  int iVar1;
  float fVar2;
  undefined4 local_1c;
  undefined4 local_18;
  int x;
  int y;
  int z;
  PixelBufferAccess *access_local;
  
  x = 0;
  while( true ) {
    iVar1 = tcu::ConstPixelBufferAccess::getDepth(&access->super_ConstPixelBufferAccess);
    if (iVar1 <= x) break;
    local_18 = 0;
    while( true ) {
      iVar1 = tcu::ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess);
      if (iVar1 <= local_18) break;
      local_1c = 0;
      while( true ) {
        iVar1 = tcu::ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
        if (iVar1 <= local_1c) break;
        fVar2 = tcu::ConstPixelBufferAccess::getPixDepth
                          (&access->super_ConstPixelBufferAccess,local_1c,local_18,x);
        fVar2 = de::clamp<float>(fVar2,0.0,1.0);
        tcu::PixelBufferAccess::setPixDepth(access,fVar2,local_1c,local_18,x);
        local_1c = local_1c + 1;
      }
      local_18 = local_18 + 1;
    }
    x = x + 1;
  }
  return;
}

Assistant:

void clampFloatingPointTexture (const tcu::PixelBufferAccess& access)
{
	DE_ASSERT(isFloatingPointDepthFormat(access.getFormat()));

	for (int z = 0; z < access.getDepth(); ++z)
	for (int y = 0; y < access.getHeight(); ++y)
	for (int x = 0; x < access.getWidth(); ++x)
		access.setPixDepth(de::clamp(access.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
}